

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O1

matrix4f * __thiscall tinyusdz::value::matrix4f::operator=(matrix4f *this,matrix4d *src)

{
  matrix4f *pmVar1;
  size_t j;
  long lVar2;
  long lVar3;
  
  pmVar1 = this;
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      (*(float (*) [4])*(float (*) [4])this)[lVar3] =
           (float)(*(double (*) [4])*(double (*) [4])src)[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    lVar2 = lVar2 + 1;
    src = (matrix4d *)((long)src + 0x20);
    this = (matrix4f *)((long)this + 0x10);
  } while (lVar2 != 4);
  return pmVar1;
}

Assistant:

matrix4f &matrix4f::operator=(const matrix4d &src) {

  for (size_t j = 0; j < 4; j++) {
    for (size_t i = 0; i < 4; i++) {
      m[j][i] = float(src.m[j][i]);
    }
  }

  return *this;
}